

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
should_convert_from_ref::Visitor::operator()
          (Visitor *this,
          VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
          *param_1,VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_l_>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<421U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<423U,_Fixpp::Type::Int>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
                   *param_2)

{
  bool bVar1;
  char *in_R9;
  string local_50;
  internal local_30 [8];
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_30[0] = (internal)0x0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::Message::Message((Message *)&local_18);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_50,local_30,(AssertionResult *)"false","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
             ,0x1d8,local_50._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_18);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_18.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_18.ptr_ + 8))();
    }
    local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void operator()(HeaderT, MessageT)
        {
            ASSERT_TRUE(false);
        }